

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

void imtqlx(int n,double *d,double *e,double *z)

{
  int iVar1;
  double dVar2;
  double x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_88;
  double s;
  double r;
  double prec;
  double p;
  int mml;
  int m;
  int l;
  int k;
  int j;
  int itn;
  int ii;
  int i;
  double g;
  double f;
  double c;
  double b;
  double *z_local;
  double *e_local;
  double *d_local;
  int n_local;
  
  p._4_4_ = 0;
  dVar2 = r8_epsilon();
  if (n != 1) {
    e[n + -1] = 0.0;
    for (mml = 1; mml <= n; mml = mml + 1) {
      l = 0;
      while( true ) {
        p._4_4_ = mml;
        while (((p._4_4_ <= n && (p._4_4_ != n)) &&
               (dVar2 * (ABS(d[p._4_4_ + -1]) + ABS(d[p._4_4_])) < ABS(e[p._4_4_ + -1])))) {
          p._4_4_ = p._4_4_ + 1;
        }
        dVar5 = d[mml + -1];
        if (p._4_4_ == mml) break;
        if (0x1d < l) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"IMTQLX - Fatal error!\n");
          std::operator<<((ostream *)&std::cerr,"  Iteration limit exceeded\n");
          exit(1);
        }
        l = l + 1;
        x = (d[mml] - dVar5) / (e[mml + -1] * 2.0);
        dVar3 = sqrt(x * x + 1.0);
        dVar6 = d[p._4_4_ + -1];
        dVar7 = e[mml + -1];
        dVar4 = r8_sign(x);
        _ii = (dVar6 - dVar5) + dVar7 / (ABS(dVar3) * dVar4 + x);
        local_88 = 1.0;
        f = 1.0;
        prec = 0.0;
        for (j = 1; j <= p._4_4_ - mml; j = j + 1) {
          iVar1 = p._4_4_ - j;
          local_88 = local_88 * e[iVar1 + -1];
          dVar5 = f * e[iVar1 + -1];
          if (ABS(local_88) < ABS(_ii)) {
            local_88 = local_88 / _ii;
            dVar6 = sqrt(local_88 * local_88 + 1.0);
            e[iVar1] = _ii * dVar6;
            f = 1.0 / dVar6;
            local_88 = local_88 * f;
          }
          else {
            _ii = _ii / local_88;
            dVar6 = sqrt(_ii * _ii + 1.0);
            e[iVar1] = local_88 * dVar6;
            local_88 = 1.0 / dVar6;
            f = _ii * local_88;
          }
          dVar6 = d[iVar1] - prec;
          dVar7 = (d[iVar1 + -1] - dVar6) * local_88 + f * 2.0 * dVar5;
          prec = local_88 * dVar7;
          d[iVar1] = dVar6 + prec;
          _ii = f * dVar7 + -dVar5;
          dVar5 = z[iVar1];
          z[iVar1] = local_88 * z[iVar1 + -1] + f * dVar5;
          z[iVar1 + -1] = f * z[iVar1 + -1] + -(local_88 * dVar5);
        }
        d[mml + -1] = d[mml + -1] - prec;
        e[mml + -1] = _ii;
        e[p._4_4_ + -1] = 0.0;
      }
    }
    for (j = 2; j <= p._4_4_; j = j + 1) {
      prec = d[j + -2];
      m = j + -1;
      for (l = j; l <= n; l = l + 1) {
        if (d[l + -1] < prec) {
          m = l;
          prec = d[l + -1];
        }
      }
      if (m != j + -1) {
        d[m + -1] = d[j + -2];
        d[j + -2] = prec;
        dVar2 = z[j + -2];
        z[j + -2] = z[m + -1];
        z[m + -1] = dVar2;
      }
    }
  }
  return;
}

Assistant:

void imtqlx ( int n, double d[], double e[], double z[] )

//****************************************************************************80
//
//  Purpose:
//
//    IMTQLX diagonalizes a symmetric tridiagonal matrix.
//
//  Discussion:
//
//    This routine is a slightly modified version of the EISPACK routine to 
//    perform the implicit QL algorithm on a symmetric tridiagonal matrix. 
//
//    The authors thank the authors of EISPACK for permission to use this
//    routine. 
//
//    It has been modified to produce the product Q' * Z, where Z is an input 
//    vector and Q is the orthogonal matrix diagonalizing the input matrix.  
//    The changes consist (essentially) of applying the orthogonal transformations
//    directly to Z as they are generated.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    08 January 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//    Roger Martin, James Wilkinson,
//    The Implicit QL Algorithm,
//    Numerische Mathematik,
//    Volume 12, Number 5, December 1968, pages 377-383.
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input/output, double D(N), the diagonal entries of the matrix.
//    On output, the information in D has been overwritten.
//
//    Input/output, double E(N), the subdiagonal entries of the 
//    matrix, in entries E(1) through E(N-1).  On output, the information in
//    E has been overwritten.
//
//    Input/output, double Z(N).  On input, a vector.  On output,
//    the value of Q' * Z, where Q is the matrix that diagonalizes the
//    input symmetric tridiagonal matrix.
//
{
  double b;
  double c;
  double f;
  double g;
  int i;
  int ii;
  int itn = 30;
  int j;
  int k;
  int l;
  int m = 0; // Silence uninitialized warning.
  int mml;
  double p;
  double prec;
  double r;
  double s;

  prec = r8_epsilon ( );

  if ( n == 1 )
  {
    return;
  }

  e[n-1] = 0.0;

  for ( l = 1; l <= n; l++ )
  {
    j = 0;
    for ( ; ; )
    {
      for ( m = l; m <= n; m++ )
      {
        if ( m == n )
        {
          break;
        }

        if ( fabs ( e[m-1] ) <= prec * ( fabs ( d[m-1] ) + fabs ( d[m] ) ) )
        {
          break;
        }
      }
      p = d[l-1];
      if ( m == l )
      {
        break;
      }
      if ( itn <= j )
      {
        std::cerr << "\n";
        std::cerr << "IMTQLX - Fatal error!\n";
        std::cerr << "  Iteration limit exceeded\n";
        exit ( 1 );
      }
      j = j + 1;
      g = ( d[l] - p ) / ( 2.0 * e[l-1] );
      r = sqrt ( g * g + 1.0 );
      g = d[m-1] - p + e[l-1] / ( g + fabs ( r ) * r8_sign ( g ) );
      s = 1.0;
      c = 1.0;
      p = 0.0;
      mml = m - l;

      for ( ii = 1; ii <= mml; ii++ )
      {
        i = m - ii;
        f = s * e[i-1];
        b = c * e[i-1];

        if ( fabs ( g ) <= fabs ( f ) )
        {
          c = g / f;
          r = sqrt ( c * c + 1.0 );
          e[i] = f * r;
          s = 1.0 / r;
          c = c * s;
        }
        else
        {
          s = f / g;
          r = sqrt ( s * s + 1.0 );
          e[i] = g * r;
          c = 1.0 / r;
          s = s * c;
        }
        g = d[i] - p;
        r = ( d[i-1] - g ) * s + 2.0 * c * b;
        p = s * r;
        d[i] = g + p;
        g = c * r - b;
        f = z[i];
        z[i] = s * z[i-1] + c * f;
        z[i-1] = c * z[i-1] - s * f;
      }
      d[l-1] = d[l-1] - p;
      e[l-1] = g;
      e[m-1] = 0.0;
    }
  }
//
//  Sorting.
//
  for ( ii = 2; ii <= m; ii++ )
  {
    i = ii - 1;
    k = i;
    p = d[i-1];

    for ( j = ii; j <= n; j++ )
    {
      if ( d[j-1] < p )
      {
         k = j;
         p = d[j-1];
      }
    }

    if ( k != i )
    {
      d[k-1] = d[i-1];
      d[i-1] = p;
      p = z[i-1];
      z[i-1] = z[k-1];
      z[k-1] = p;
    }
  }
  return;
}